

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::Promise<void_*>_> * __thiscall
kj::_::NullableValue<kj::Promise<void_*>_>::operator=
          (NullableValue<kj::Promise<void_*>_> *this,NullableValue<kj::Promise<void_*>_> *other)

{
  Promise<void_*> *params;
  NullableValue<kj::Promise<void_*>_> *other_local;
  NullableValue<kj::Promise<void_*>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::Promise<void*>>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::Promise<void*>>(&(other->field_1).value);
      ctor<kj::Promise<void*>,kj::Promise<void*>>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }